

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DETECT_TRAPS(effect_handler_context_t_conflict *context)

{
  bool bVar1;
  chunk_conflict *c;
  _Bool _Var2;
  loc_conflict lVar3;
  square_conflict *psVar4;
  loc_conflict grid;
  object *obj;
  wchar_t local_28;
  wchar_t wStack_24;
  _Bool detect;
  wchar_t y2;
  wchar_t y1;
  wchar_t x2;
  wchar_t x1;
  wchar_t y;
  wchar_t x;
  effect_handler_context_t_conflict *context_local;
  
  bVar1 = false;
  wStack_24 = (player->grid).y - context->y;
  local_28 = (player->grid).y + context->y;
  y1 = (player->grid).x - context->x;
  y2 = (player->grid).x + context->x;
  if (wStack_24 < L'\0') {
    wStack_24 = L'\0';
  }
  if (y1 < L'\0') {
    y1 = L'\0';
  }
  if (cave->height + L'\xffffffff' < local_28) {
    local_28 = cave->height + L'\xffffffff';
  }
  if (cave->width + L'\xffffffff' < y2) {
    y2 = cave->width + L'\xffffffff';
  }
  for (x2 = wStack_24; x2 < local_28; x2 = x2 + L'\x01') {
    for (x1 = y1; x1 < y2; x1 = x1 + L'\x01') {
      lVar3 = (loc_conflict)loc(x1,x2);
      _Var2 = square_in_bounds_fully((chunk *)cave,lVar3);
      if (_Var2) {
        _Var2 = square_isplayertrap((chunk *)cave,lVar3);
        if ((_Var2) && (_Var2 = square_reveal_trap((chunk_conflict2 *)cave,lVar3,true,false), _Var2)
           ) {
          bVar1 = true;
        }
        for (grid = (loc_conflict)square_object((chunk *)cave,lVar3); c = cave,
            grid != (loc_conflict)0x0; grid = *(loc_conflict *)((long)grid + 0x20)) {
          _Var2 = is_trapped_chest((object *)grid);
          if (((_Var2) && (_Var2 = ignore_item_ok(player,(object *)grid), !_Var2)) &&
             ((*(long *)((long)grid + 0x28) == 0 ||
              (*(short *)(*(long *)((long)grid + 0x28) + 0x3e) != *(short *)((long)grid + 0x3e)))))
          {
            object_see(player,(object *)grid);
            *(undefined2 *)(*(long *)((long)grid + 0x28) + 0x3e) =
                 *(undefined2 *)((long)grid + 0x3e);
            bVar1 = true;
          }
        }
        lVar3 = (loc_conflict)loc(x1,x2);
        psVar4 = square((chunk *)c,lVar3);
        flag_on_dbg(psVar4->info,3,0x13,"square(cave, loc(x, y))->info","SQUARE_DTRAP");
      }
    }
  }
  if (bVar1) {
    msg("You sense the presence of traps!");
  }
  else {
    msg("You sense no traps.");
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_TRAPS(effect_handler_context_t *context)
{
	int x, y;
	int x1, x2, y1, y2;

	bool detect = false;

	struct object *obj;

	/* Pick an area to detect */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;


	/* Scan the dungeon */
	for (y = y1; y < y2; y++) {
		for (x = x1; x < x2; x++) {
			struct loc grid = loc(x, y);

			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Detect traps */
			if (square_isplayertrap(cave, grid))
				/* Reveal trap */
				if (square_reveal_trap(cave, grid, true, false))
					detect = true;

			/* Scan all objects in the grid to look for traps on chests */
			for (obj = square_object(cave, grid); obj; obj = obj->next) {
				/* Skip anything not a trapped chest */
				if (!is_trapped_chest(obj)
						|| ignore_item_ok(player, obj)) {
					continue;
				}

				/* Identify once */
				if (!obj->known || obj->known->pval != obj->pval) {
					/* Hack - see the object */
					object_see(player, obj);

					/* Know the trap */
					obj->known->pval = obj->pval;

					/* We found something to detect */
					detect = true;
				}
			}
			/* Mark as trap-detected */
			sqinfo_on(square(cave, loc(x, y))->info, SQUARE_DTRAP);
		}
	}

	/* Describe */
	if (detect)
		msg("You sense the presence of traps!");

	/* Trap detection always makes you aware, even if no traps are present */
	else
		msg("You sense no traps.");

	/* Notice */
	context->ident = true;

	return true;
}